

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,true>::insert_media
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,true> *this)

{
  Media *in_RSI;
  
  ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::insert_media
            ((ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *)(this + -0x38),
             in_RSI);
  return;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(!media.disks.empty()) {
				auto diskii = diskii_card();
				if(diskii) diskii->set_disk(media.disks[0], 0);
			}

			if(!media.mass_storage_devices.empty()) {
				auto scsi = scsi_card();
				if(scsi) scsi->set_storage_device(media.mass_storage_devices[0]);
			}

			return true;
		}